

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O1

string * anon_unknown.dwarf_9b16::scrape_type_text(xml_node node)

{
  bool bVar1;
  int iVar2;
  char_t *pcVar3;
  string *in_RDI;
  char *__s;
  xml_node_iterator __end1;
  xml_node_iterator __begin1;
  xml_node local_98;
  xml_node_struct *local_90;
  xml_node_struct *pxStack_88;
  undefined1 local_80 [32];
  char local_60 [16];
  xml_node_iterator local_50;
  xml_node_iterator local_40;
  
  pugi::xml_node::name(&local_98);
  local_90 = (xml_node_struct *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"apientry","");
  iVar2 = std::__cxx11::string::compare((char *)&local_90);
  if (local_90 != (xml_node_struct *)local_80) {
    operator_delete(local_90);
  }
  if (iVar2 == 0) {
    (in_RDI->super_string)._M_dataplus._M_p = (pointer)&(in_RDI->super_string).field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    pcVar3 = pugi::xml_node::value(&local_98);
    __s = "";
    if (pcVar3 != (char_t *)0x0) {
      __s = pcVar3;
    }
    (in_RDI->super_string)._M_dataplus._M_p = (pointer)&(in_RDI->super_string).field_2;
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
    pugi::xml_node::children(&local_98);
    local_40._wrap._root = local_90;
    local_40._parent._root = pxStack_88;
    local_50._wrap._root = (xml_node_struct *)local_80._0_8_;
    local_50._parent._root = (xml_node_struct *)local_80._8_8_;
    while( true ) {
      bVar1 = pugi::xml_node_iterator::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      pugi::xml_node_iterator::operator*(&local_40);
      scrape_type_text((xml_node)0x110280);
      wire::string::operator<<(in_RDI,(string *)(local_80 + 0x10));
      if ((char *)local_80._16_8_ != local_60) {
        operator_delete((void *)local_80._16_8_);
      }
      pugi::xml_node_iterator::operator++(&local_40);
    }
  }
  return in_RDI;
}

Assistant:

wire::string scrape_type_text(const pugi::xml_node node)
{
  if (node.name() == wire::string("apientry"))
    return "GLAPIENTRY";

  wire::string result = node.value();

  for (const pugi::xml_node child : node.children())
    result += scrape_type_text(child);

  return result;
}